

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spell_corrector.cpp
# Opt level: O0

vector<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_double>,_std::allocator<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_double>_>_>
* __thiscall
NJamSpell::TSpellCorrector::GetCandidatesWithScores
          (vector<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_double>,_std::allocator<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_double>_>_>
           *__return_storage_ptr__,TSpellCorrector *this,
          vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
          *sentence,size_t position)

{
  wchar_t *pwVar1;
  wchar_t *pwVar2;
  bool bVar3;
  reference pTVar4;
  pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_double>
  local_108;
  allocator local_d9;
  wstring local_d8 [8];
  wstring word;
  TScoredWord s;
  iterator __end1;
  iterator __begin1;
  TScoredWords *__range1;
  undefined1 local_80 [8];
  TScoredWords scoredCandidates;
  allocator<NJamSpell::TWord> local_51;
  __normal_iterator<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_*,_std::vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>
  local_50;
  __normal_iterator<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_*,_std::vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>
  local_48;
  undefined1 local_40 [8];
  TWords words;
  size_t position_local;
  vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  *sentence_local;
  TSpellCorrector *this_local;
  vector<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_double>,_std::allocator<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_double>_>_>
  *results;
  
  words.super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)position;
  local_48._M_current =
       (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
       std::
       vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
       ::begin(sentence);
  local_50._M_current =
       (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
       std::
       vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
       ::end(sentence);
  std::allocator<NJamSpell::TWord>::allocator(&local_51);
  std::vector<NJamSpell::TWord,std::allocator<NJamSpell::TWord>>::
  vector<__gnu_cxx::__normal_iterator<std::__cxx11::wstring_const*,std::vector<std::__cxx11::wstring,std::allocator<std::__cxx11::wstring>>>,void>
            ((vector<NJamSpell::TWord,std::allocator<NJamSpell::TWord>> *)local_40,local_48,local_50
             ,&local_51);
  std::allocator<NJamSpell::TWord>::~allocator(&local_51);
  GetCandidatesRawWithScores
            ((TScoredWords *)local_80,this,(TWords *)local_40,
             (size_t)words.super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_double>,_std::allocator<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_double>_>_>
  ::vector(__return_storage_ptr__);
  __end1 = std::vector<NJamSpell::TScoredWord,_std::allocator<NJamSpell::TScoredWord>_>::begin
                     ((vector<NJamSpell::TScoredWord,_std::allocator<NJamSpell::TScoredWord>_> *)
                      local_80);
  s.Score = (double)std::vector<NJamSpell::TScoredWord,_std::allocator<NJamSpell::TScoredWord>_>::
                    end((vector<NJamSpell::TScoredWord,_std::allocator<NJamSpell::TScoredWord>_> *)
                        local_80);
  while (bVar3 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<NJamSpell::TScoredWord_*,_std::vector<NJamSpell::TScoredWord,_std::allocator<NJamSpell::TScoredWord>_>_>
                                     *)&s.Score), bVar3) {
    pTVar4 = __gnu_cxx::
             __normal_iterator<NJamSpell::TScoredWord_*,_std::vector<NJamSpell::TScoredWord,_std::allocator<NJamSpell::TScoredWord>_>_>
             ::operator*(&__end1);
    s.Word.Len = (size_t)pTVar4->Score;
    pwVar1 = (pTVar4->Word).Ptr;
    pwVar2 = (wchar_t *)(pTVar4->Word).Len;
    s.Word.Ptr = pwVar2;
    std::allocator<wchar_t>::allocator();
    std::__cxx11::wstring::wstring(local_d8,pwVar1,(ulong)pwVar2,&local_d9);
    std::allocator<wchar_t>::~allocator((allocator<wchar_t> *)&local_d9);
    std::make_pair<std::__cxx11::wstring&,double&>
              (&local_108,
               (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
               local_d8,(double *)&s.Word.Len);
    std::
    vector<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_double>,_std::allocator<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_double>_>_>
    ::push_back(__return_storage_ptr__,&local_108);
    std::
    pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_double>
    ::~pair(&local_108);
    std::__cxx11::wstring::~wstring(local_d8);
    __gnu_cxx::
    __normal_iterator<NJamSpell::TScoredWord_*,_std::vector<NJamSpell::TScoredWord,_std::allocator<NJamSpell::TScoredWord>_>_>
    ::operator++(&__end1);
  }
  std::vector<NJamSpell::TScoredWord,_std::allocator<NJamSpell::TScoredWord>_>::~vector
            ((vector<NJamSpell::TScoredWord,_std::allocator<NJamSpell::TScoredWord>_> *)local_80);
  std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>::~vector
            ((vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_> *)local_40);
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::pair<std::wstring,double> > TSpellCorrector::GetCandidatesWithScores(
    const std::vector<std::wstring>& sentence,
    size_t position
) const {

    TWords words(sentence.begin(), sentence.end());
    TScoredWords scoredCandidates = GetCandidatesRawWithScores(words, position);

    std::vector<std::pair<std::wstring,double> > results;
    for (auto s: scoredCandidates) {
        std::wstring word = std::wstring(s.Word.Ptr, s.Word.Len);
        results.push_back(std::make_pair(word, s.Score));
    }
    return results;
}